

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_entropy.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  FILE *__s;
  uchar local_478 [8];
  uchar buf [64];
  mbedtls_entropy_context entropy;
  int exit_code;
  int ret;
  int k;
  int i;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  entropy.source[0x13].strong = 1;
  if (argc < 2) {
    fprintf(_stderr,"usage: %s <output filename>\n",*argv);
    argv_local._4_4_ = 1;
  }
  else {
    __s = fopen(argv[1],"wb+");
    if (__s == (FILE *)0x0) {
      printf("failed to open \'%s\' for writing.\n",argv[1]);
      argv_local._4_4_ = 1;
    }
    else {
      mbedtls_entropy_init((mbedtls_entropy_context *)(buf + 0x38));
      for (ret = 0; ret < 0x300; ret = ret + 1) {
        uVar1 = mbedtls_entropy_func(buf + 0x38,local_478,0x40);
        if (uVar1 != 0) {
          printf("  failed\n  !  mbedtls_entropy_func returned -%04X\n",(ulong)uVar1);
          goto LAB_001023e6;
        }
        fwrite(local_478,1,0x40,__s);
        printf("Generating %ldkb of data in file \'%s\'... %04.1f%% done\r",
               (double)(((float)(ret + 1) * 100.0) / 768.0),0x30,argv[1]);
        fflush(_stdout);
      }
      entropy.source[0x13].strong = 0;
LAB_001023e6:
      printf("\n");
      fclose(__s);
      mbedtls_entropy_free((mbedtls_entropy_context *)(buf + 0x38));
      argv_local._4_4_ = entropy.source[0x13].strong;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int i, k, ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_entropy_context entropy;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if( argc < 2 )
    {
        mbedtls_fprintf( stderr, "usage: %s <output filename>\n", argv[0] );
        return( exit_code );
    }

    if( ( f = fopen( argv[1], "wb+" ) ) == NULL )
    {
        mbedtls_printf( "failed to open '%s' for writing.\n", argv[1] );
        return( exit_code );
    }

    mbedtls_entropy_init( &entropy );

    for( i = 0, k = 768; i < k; i++ )
    {
        ret = mbedtls_entropy_func( &entropy, buf, sizeof( buf ) );
        if( ret != 0 )
        {
            mbedtls_printf( "  failed\n  !  mbedtls_entropy_func returned -%04X\n",
                            ret );
            goto cleanup;
        }

        fwrite( buf, 1, sizeof( buf ), f );

        mbedtls_printf( "Generating %ldkb of data in file '%s'... %04.1f" \
                "%% done\r", (long)(sizeof(buf) * k / 1024), argv[1], (100 * (float) (i + 1)) / k );
        fflush( stdout );
    }

    exit_code = MBEDTLS_EXIT_SUCCESS;

cleanup:
    mbedtls_printf( "\n" );

    fclose( f );
    mbedtls_entropy_free( &entropy );

    return( exit_code );
}